

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CovergroupBodySymbol::CovergroupBodySymbol
          (CovergroupBodySymbol *this,Compilation *comp,SourceLocation loc)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  Symbol *pSVar1;
  SourceLocation in_RDX;
  Compilation *in_RSI;
  Symbol *in_RDI;
  bool in_stack_0000005f;
  Scope *in_stack_00000060;
  StructBuilder type_option;
  StructBuilder option;
  LanguageVersion lv;
  Type *real_t;
  Type *string_t;
  Type *bit_t;
  Type *int_t;
  size_t in_stack_fffffffffffffcc8;
  Type *in_stack_fffffffffffffcd0;
  Compilation *in_stack_fffffffffffffcd8;
  Type *pTVar2;
  Scope *in_stack_fffffffffffffce0;
  bitmask<slang::ast::VariableFlags> flags;
  Type *structBuilder;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffcec;
  VariableLifetime lifetime;
  char *in_stack_fffffffffffffcf0;
  Type *scope;
  char *in_stack_fffffffffffffd00;
  Type *pTVar4;
  StructBuilder *in_stack_fffffffffffffd40;
  Scope *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  Type *pTVar5;
  bitmask<slang::ast::VariableFlags> local_272;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  bitmask<slang::ast::VariableFlags> local_25a;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  bitmask<slang::ast::VariableFlags> local_242;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  bitmask<slang::ast::VariableFlags> local_22a;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  bitmask<slang::ast::VariableFlags> local_212;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  bitmask<slang::ast::VariableFlags> local_1fa;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  bitmask<slang::ast::VariableFlags> local_1e2;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  undefined8 local_1d0;
  undefined8 local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  bitmask<slang::ast::VariableFlags> local_18a;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  bitmask<slang::ast::VariableFlags> local_172;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  bitmask<slang::ast::VariableFlags> local_15a;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  bitmask<slang::ast::VariableFlags> local_142;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  bitmask<slang::ast::VariableFlags> local_12a;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  bitmask<slang::ast::VariableFlags> local_112;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  bitmask<slang::ast::VariableFlags> local_fa;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  bitmask<slang::ast::VariableFlags> local_e2;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  bitmask<slang::ast::VariableFlags> local_ca;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  bitmask<slang::ast::VariableFlags> local_b2;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  bitmask<slang::ast::VariableFlags> local_9a;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined8 local_88;
  undefined8 local_80;
  LanguageVersion local_54;
  Type *local_50;
  Type *local_48;
  Type *local_40;
  Type *local_38;
  SourceLocation local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Compilation *local_18;
  SourceLocation local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDX;
  local_28 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_30 = local_8;
  Symbol::Symbol(in_RDI,CovergroupBody,local_28,local_8);
  Scope::Scope(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               &in_stack_fffffffffffffcd0->super_Symbol);
  flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffce0 >> 0x30);
  std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::span
            ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)0x5e38da);
  in_RDI[2].name._M_len = 0;
  local_38 = Compilation::getIntType(local_18);
  local_40 = Compilation::getBitType(local_18);
  local_48 = Compilation::getStringType(local_18);
  local_50 = Compilation::getRealType(local_18);
  local_54 = Compilation::languageVersion((Compilation *)0x5e394b);
  local_88 = LookupLocation::min;
  local_80 = DAT_00fffda0;
  lookupLocation._8_8_ = in_stack_fffffffffffffd50;
  lookupLocation.scope = in_stack_fffffffffffffd48;
  StructBuilder::StructBuilder(in_stack_fffffffffffffd40,(Scope *)in_RDI,lookupLocation);
  local_98 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  pTVar4 = local_48;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_9a,None);
  name._M_len._4_4_ = in_stack_fffffffffffffcec;
  name._M_len._0_4_ = in_stack_fffffffffffffce8;
  name._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name,in_stack_fffffffffffffcd0,flags);
  local_b0 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  pTVar2 = local_38;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_b2,None);
  name_00._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_00._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_00._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_00,in_stack_fffffffffffffcd0,flags);
  local_c8 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  pTVar5 = local_38;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_ca,None);
  name_01._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_01._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_01._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_01,in_stack_fffffffffffffcd0,flags);
  local_e0 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_e2,None);
  name_02._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_02._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_02._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_02,in_stack_fffffffffffffcd0,flags);
  local_f8 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_fa,None);
  name_03._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_03._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_03._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_03,in_stack_fffffffffffffcd0,flags);
  local_110 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_112,ImmutableCoverageOption);
  name_04._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_04._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_04._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_04,in_stack_fffffffffffffcd0,flags);
  local_128 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_12a,None);
  name_05._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_05._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_05._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_05,in_stack_fffffffffffffcd0,flags);
  if (0 < (int)local_54) {
    local_140 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    bitmask<slang::ast::VariableFlags>::bitmask(&local_142,ImmutableCoverageOption);
    name_06._M_len._4_4_ = in_stack_fffffffffffffcec;
    name_06._M_len._0_4_ = in_stack_fffffffffffffce8;
    name_06._M_str = in_stack_fffffffffffffcf0;
    StructBuilder::addField
              ((StructBuilder *)in_stack_fffffffffffffcd8,name_06,in_stack_fffffffffffffcd0,flags);
  }
  local_158 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  structBuilder = local_40;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_15a,ImmutableCoverageOption);
  name_07._M_len._4_4_ = in_stack_fffffffffffffcec;
  name_07._M_len._0_4_ = in_stack_fffffffffffffce8;
  name_07._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_07,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_170 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  uVar3 = SUB84(local_40,0);
  lifetime = (VariableLifetime)((ulong)local_40 >> 0x20);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_172,ImmutableCoverageOption);
  name_08._M_len._4_4_ = lifetime;
  name_08._M_len._0_4_ = uVar3;
  name_08._M_str = in_stack_fffffffffffffcf0;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_08,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_188 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  scope = local_40;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_18a,ImmutableCoverageOption);
  name_09._M_len._4_4_ = lifetime;
  name_09._M_len._0_4_ = uVar3;
  name_09._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_09,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  pSVar1 = in_RDI + 1;
  local_1a0 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  name_17._M_str = in_stack_fffffffffffffd00;
  name_17._M_len = (size_t)pSVar1;
  addProperty((Scope *)scope,name_17,lifetime,(StructBuilder *)structBuilder);
  local_1d0 = LookupLocation::min;
  local_1c8 = DAT_00fffda0;
  lookupLocation_00._8_8_ = pTVar5;
  lookupLocation_00.scope = (Scope *)pTVar2;
  StructBuilder::StructBuilder((StructBuilder *)pTVar4,(Scope *)in_RDI,lookupLocation_00);
  local_1e0 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  pTVar4 = local_38;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_1e2,None);
  name_10._M_len._4_4_ = lifetime;
  name_10._M_len._0_4_ = uVar3;
  name_10._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_10,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_1f8 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_1fa,None);
  name_11._M_len._4_4_ = lifetime;
  name_11._M_len._0_4_ = uVar3;
  name_11._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_11,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_210 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_212,None);
  name_12._M_len._4_4_ = lifetime;
  name_12._M_len._0_4_ = uVar3;
  name_12._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_12,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_228 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_22a,ImmutableCoverageOption);
  name_13._M_len._4_4_ = lifetime;
  name_13._M_len._0_4_ = uVar3;
  name_13._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_13,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_240 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_242,None);
  name_14._M_len._4_4_ = lifetime;
  name_14._M_len._0_4_ = uVar3;
  name_14._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_14,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  local_258 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_25a,None);
  name_15._M_len._4_4_ = lifetime;
  name_15._M_len._0_4_ = uVar3;
  name_15._M_str = (char *)scope;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffcd8,name_15,in_stack_fffffffffffffcd0,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  if (0 < (int)local_54) {
    local_270 = sv((char *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    pTVar2 = local_50;
    bitmask<slang::ast::VariableFlags>::bitmask(&local_272,ImmutableCoverageOption);
    name_16._M_len._4_4_ = lifetime;
    name_16._M_len._0_4_ = uVar3;
    name_16._M_str = (char *)scope;
    StructBuilder::addField
              ((StructBuilder *)pTVar2,name_16,in_stack_fffffffffffffcd0,
               (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  }
  sv((char *)(in_RDI + 1),in_stack_fffffffffffffcc8);
  name_18._M_str = (char *)pTVar4;
  name_18._M_len = (size_t)pSVar1;
  addProperty((Scope *)scope,name_18,lifetime,(StructBuilder *)structBuilder);
  addBuiltInMethods(in_stack_00000060,in_stack_0000005f);
  pSVar1 = Scope::getLastMember((Scope *)(in_RDI + 1));
  in_RDI[2].name._M_len = (size_t)pSVar1;
  return;
}

Assistant:

CovergroupBodySymbol::CovergroupBodySymbol(Compilation& comp, SourceLocation loc) :
    Symbol(SymbolKind::CovergroupBody, ""sv, loc), Scope(comp, this) {

    auto& int_t = comp.getIntType();
    auto& bit_t = comp.getBitType();
    auto& string_t = comp.getStringType();
    auto& real_t = comp.getRealType();
    auto lv = comp.languageVersion();

    StructBuilder option(*this, LookupLocation::min);
    option.addField("name"sv, string_t);
    option.addField("weight"sv, int_t);
    option.addField("goal"sv, int_t);
    option.addField("comment"sv, string_t);
    option.addField("at_least"sv, int_t);
    option.addField("auto_bin_max"sv, int_t, VariableFlags::ImmutableCoverageOption);
    option.addField("cross_num_print_missing"sv, int_t);
    if (lv >= LanguageVersion::v1800_2023)
        option.addField("cross_retain_auto_bins"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    option.addField("detect_overlap"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    option.addField("per_instance"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    option.addField("get_inst_coverage"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "option"sv, VariableLifetime::Automatic, option);

    StructBuilder type_option(*this, LookupLocation::min);
    type_option.addField("weight"sv, int_t);
    type_option.addField("goal"sv, int_t);
    type_option.addField("comment"sv, string_t);
    type_option.addField("strobe"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    type_option.addField("merge_instances"sv, bit_t);
    type_option.addField("distribute_first"sv, bit_t);
    if (lv >= LanguageVersion::v1800_2023)
        type_option.addField("real_interval"sv, real_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "type_option"sv, VariableLifetime::Static, type_option);

    addBuiltInMethods(*this, true);

    lastBuiltinMember = getLastMember();
}